

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

Model * MeCab::createModel(char *arg)

{
  uint uVar1;
  int __oflag;
  char *in_RDI;
  ModelImpl *unaff_retaddr;
  ModelImpl *model;
  ModelImpl *local_8;
  
  local_8 = (ModelImpl *)operator_new(0x30);
  anon_unknown_0::ModelImpl::ModelImpl(unaff_retaddr);
  uVar1 = anon_unknown_0::ModelImpl::open(local_8,in_RDI,__oflag);
  if ((uVar1 & 1) == 0) {
    if (local_8 != (ModelImpl *)0x0) {
      (*(local_8->super_Model)._vptr_Model[7])();
    }
    local_8 = (ModelImpl *)0x0;
  }
  return &local_8->super_Model;
}

Assistant:

Model *createModel(const char *arg) {
  ModelImpl *model = new ModelImpl;
  if (!model->open(arg)) {
    delete model;
    return 0;
  }
  return model;
}